

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O0

Tree vmergetree(Tree t1,Tree t2)

{
  Tree TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Branch *pBVar6;
  Branch *pBVar7;
  Branch *pBVar8;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  int coord2;
  int coord1;
  int offset2;
  int offset1;
  int extra;
  int next;
  int curr;
  int prev;
  int i;
  Tree t2_local;
  Tree t1_local;
  Tree t;
  
  pBVar7 = t2.branch;
  pBVar8 = t1.branch;
  t2_local.branch._0_4_ = t1.deg;
  prev = t2.deg;
  iVar3 = (int)t2_local.branch + prev + -1;
  t2_local.branch._4_4_ = t1.length;
  i = t2.length;
  t1_local.branch._4_4_ = t2_local.branch._4_4_ + i;
  pBVar6 = (Branch *)malloc((long)(iVar3 * 2 + -2) * 0xc);
  iVar4 = prev + -1;
  iVar5 = (int)t2_local.branch * 2 + -3;
  for (curr = 0; curr <= (int)t2_local.branch + -2; curr = curr + 1) {
    pBVar6[curr].x = pBVar8[curr].x;
    pBVar6[curr].y = pBVar8[curr].y;
    pBVar6[curr].n = pBVar8[curr].n + iVar4;
  }
  for (curr = (int)t2_local.branch + -1; iVar2 = iVar3, curr <= (int)t2_local.branch + prev + -2;
      curr = curr + 1) {
    pBVar6[curr].x = pBVar7[(curr - (int)t2_local.branch) + 1].x;
    pBVar6[curr].y = pBVar7[(curr - (int)t2_local.branch) + 1].y;
    pBVar6[curr].n = pBVar7[(curr - (int)t2_local.branch) + 1].n + iVar5;
  }
  while (curr = iVar2, curr <= iVar3 + (int)t2_local.branch + -3) {
    pBVar6[curr].x = pBVar8[curr - iVar4].x;
    pBVar6[curr].y = pBVar8[curr - iVar4].y;
    pBVar6[curr].n = pBVar8[curr - iVar4].n + iVar4;
    iVar2 = curr + 1;
  }
  for (curr = iVar3 + (int)t2_local.branch + -2; curr <= iVar3 * 2 + -4; curr = curr + 1) {
    pBVar6[curr].x = pBVar7[curr - iVar5].x;
    pBVar6[curr].y = pBVar7[curr - iVar5].y;
    pBVar6[curr].n = pBVar7[curr - iVar5].n + iVar5;
  }
  next = iVar3 * 2 + -3;
  iVar5 = pBVar8[pBVar8[(int)t2_local.branch + -1].n].x;
  local_74 = pBVar7[pBVar7->n].x;
  local_64 = local_74;
  if (local_74 < iVar5) {
    local_64 = iVar5;
  }
  if (local_64 < pBVar7->x) {
    local_68 = local_74;
    if (local_74 < iVar5) {
      local_68 = iVar5;
    }
    pBVar6[next].x = local_68;
    t1_local.branch._4_4_ = t1_local.branch._4_4_ - (pBVar7->x - pBVar6[next].x);
  }
  else {
    local_70 = local_74;
    if (iVar5 < local_74) {
      local_70 = iVar5;
    }
    if (pBVar7->x < local_70) {
      if (iVar5 < local_74) {
        local_74 = iVar5;
      }
      pBVar6[next].x = local_74;
      t1_local.branch._4_4_ = t1_local.branch._4_4_ - (pBVar6[next].x - pBVar7->x);
    }
    else {
      pBVar6[next].x = pBVar7->x;
    }
  }
  pBVar6[next].y = pBVar7->y;
  pBVar6[next].n = pBVar6[(int)t2_local.branch + -1].n;
  pBVar6[(int)t2_local.branch + -1].n = next;
  extra = pBVar8[(int)t2_local.branch + -1].n + iVar4;
  for (offset1 = pBVar6[extra].n; extra != offset1; offset1 = pBVar6[offset1].n) {
    pBVar6[extra].n = next;
    next = extra;
    extra = offset1;
  }
  pBVar6[extra].n = next;
  TVar1.length = t1_local.branch._4_4_;
  TVar1.deg = iVar3;
  TVar1.branch = pBVar6;
  return TVar1;
}

Assistant:

Tree vmergetree(Tree t1, Tree t2)
{
    int i, prev, curr, next, extra, offset1, offset2;
    DTYPE coord1, coord2;
    Tree t;

    t.deg = t1.deg + t2.deg - 1;
    t.length = t1.length + t2.length;
    t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));
    offset1 = t2.deg-1;
    offset2 = 2*t1.deg-3;

    for (i=0; i<=t1.deg-2; i++) {
        t.branch[i].x = t1.branch[i].x;
        t.branch[i].y = t1.branch[i].y;
        t.branch[i].n = t1.branch[i].n + offset1;
    }
    for (i=t1.deg-1; i<=t.deg-1; i++) {
        t.branch[i].x = t2.branch[i-t1.deg+1].x;
        t.branch[i].y = t2.branch[i-t1.deg+1].y;
        t.branch[i].n = t2.branch[i-t1.deg+1].n + offset2;
    }
    for (i=t.deg; i<=t.deg+t1.deg-3; i++) {
        t.branch[i].x = t1.branch[i-offset1].x;
        t.branch[i].y = t1.branch[i-offset1].y;
        t.branch[i].n = t1.branch[i-offset1].n + offset1;
    }
    for (i=t.deg+t1.deg-2; i<=2*t.deg-4; i++) {
        t.branch[i].x = t2.branch[i-offset2].x;
        t.branch[i].y = t2.branch[i-offset2].y;
        t.branch[i].n = t2.branch[i-offset2].n + offset2;
    }
    extra = 2*t.deg-3;
    coord1 = t1.branch[t1.branch[t1.deg-1].n].x;
    coord2 = t2.branch[t2.branch[0].n].x;
    if (t2.branch[0].x > max(coord1, coord2)) {
        t.branch[extra].x = max(coord1, coord2);
        t.length -= t2.branch[0].x - t.branch[extra].x;
    }        
    else if (t2.branch[0].x < min(coord1, coord2)) {
        t.branch[extra].x = min(coord1, coord2);
        t.length -= t.branch[extra].x - t2.branch[0].x;
    }
    else t.branch[extra].x = t2.branch[0].x;
    t.branch[extra].y = t2.branch[0].y;
    t.branch[extra].n = t.branch[t1.deg-1].n;
    t.branch[t1.deg-1].n = extra;

    prev = extra;
    curr = t1.branch[t1.deg-1].n + offset1;
    next = t.branch[curr].n;
    while (curr != next) {
        t.branch[curr].n = prev;
        prev = curr;
        curr = next;
        next = t.branch[curr].n;
    }
    t.branch[curr].n = prev;

    return t;
}